

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  pointer data;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint8 *puVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  size_t __n;
  
  if (this->end_ <= ptr) {
    ptr = EnsureSpaceFallback(this,ptr);
  }
  uVar3 = s->_M_string_length;
  uVar7 = num << 3;
  if (uVar7 < 0x80) {
    *ptr = (byte)uVar7 | 2;
    pbVar5 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar7 | 0x82;
    if (uVar7 < 0x4000) {
      ptr[1] = (byte)(uVar7 >> 7);
      pbVar5 = ptr + 2;
    }
    else {
      pbVar5 = ptr + 2;
      uVar7 = uVar7 >> 7;
      do {
        pbVar6 = pbVar5;
        pbVar6[-1] = (byte)uVar7 | 0x80;
        uVar2 = uVar7 >> 7;
        pbVar5 = pbVar6 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar2;
      } while (bVar1);
      *pbVar6 = (byte)uVar2;
    }
  }
  uVar7 = (uint)uVar3;
  if (uVar7 < 0x80) {
    uVar3 = uVar3 & 0xffffffff;
  }
  else {
    uVar3 = uVar3 & 0xffffffff;
    do {
      uVar2 = (uint)uVar3;
      *pbVar5 = (byte)uVar3 | 0x80;
      uVar3 = uVar3 >> 7;
      pbVar5 = pbVar5 + 1;
    } while (0x3fff < uVar2);
  }
  *pbVar5 = (byte)uVar3;
  pbVar5 = pbVar5 + 1;
  data = (s->_M_dataplus)._M_p;
  __n = (size_t)(int)uVar7;
  if ((long)this->end_ - (long)pbVar5 < (long)__n) {
    puVar4 = WriteRawFallback(this,data,uVar7,pbVar5);
    return puVar4;
  }
  memcpy(pbVar5,data,__n);
  return pbVar5 + __n;
}

Assistant:

uint8* EpsCopyOutputStream::WriteStringOutline(uint32 num, const std::string& s,
                                               uint8* ptr) {
  EnsureSpace(&ptr);
  uint32 size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}